

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadArenaString
          (EpsCopyInputStream *this,char *ptr,ArenaStringPtr *s,Arena *arena)

{
  byte bVar1;
  char *pcVar2;
  Nonnull<const_char_*> pcVar3;
  ArenaStringPtr *unaff_RBX;
  uint unaff_EBP;
  undefined1 *v1;
  string *unaff_R12;
  EpsCopyInputStream *unaff_R14;
  char *unaff_R15;
  pair<const_char_*,_int> pVar4;
  
  v1 = &stack0xffffffffffffffc8;
  if (arena == (Arena *)0x0) {
    ReadArenaString((EpsCopyInputStream *)&stack0xffffffffffffffc8);
  }
  else {
    bVar1 = *ptr;
    unaff_EBP = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      pVar4 = ReadSizeFallback(ptr,(uint)bVar1);
      unaff_R15 = pVar4.first;
      unaff_EBP = pVar4.second;
    }
    else {
      unaff_R15 = ptr + 1;
    }
    if (unaff_R15 == (char *)0x0) {
      return (char *)0x0;
    }
    unaff_R12 = (string *)ThreadSafeArena::AllocateFromStringBlock(&arena->impl_);
    (unaff_R12->_M_dataplus)._M_p = (pointer)&unaff_R12->field_2;
    unaff_R12->_M_string_length = 0;
    (unaff_R12->field_2)._M_local_buf[0] = '\0';
    v1 = (undefined1 *)((ulong)unaff_R12 & 3);
    unaff_RBX = s;
    unaff_R14 = this;
    if (v1 == (undefined1 *)0x0) {
      pcVar3 = (Nonnull<const_char_*>)0x0;
      goto LAB_001ed563;
    }
  }
  pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                     ((unsigned_long)v1,0,"reinterpret_cast<uintptr_t>(p) & kMask == 0UL");
LAB_001ed563:
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    (unaff_RBX->tagged_ptr_).ptr_ = (void *)((ulong)unaff_R12 | 3);
    pcVar2 = ReadString(unaff_R14,unaff_R15,unaff_EBP,unaff_R12);
    return pcVar2;
  }
  ReadArenaString();
}

Assistant:

const char* EpsCopyInputStream::ReadArenaString(const char* ptr,
                                                ArenaStringPtr* s,
                                                Arena* arena) {
  ScopedCheckPtrInvariants check(&s->tagged_ptr_);
  ABSL_DCHECK(arena != nullptr);

  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;

  auto* str = s->NewString(arena);
  ptr = ReadString(ptr, size, str);
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  return ptr;
}